

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

bool AssertResolvableType(ExpressionContext *ctx,SynBase *source,TypeBase *type,bool allowGeneric)

{
  bool bVar1;
  bool allowGeneric_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  bVar1 = isType<TypeArgumentSet>(type);
  if (bVar1) {
    anon_unknown.dwarf_8df1c::Report
              (ctx,source,
               "ERROR: expected \'.first\'/\'.last\'/\'[N]\'/\'.size\' after \'argument\'");
    ctx_local._7_1_ = false;
  }
  else {
    bVar1 = isType<TypeMemberSet>(type);
    if (bVar1) {
      anon_unknown.dwarf_8df1c::Report(ctx,source,"ERROR: expected \'(\' after \'hasMember\'");
      ctx_local._7_1_ = false;
    }
    else if (((type->isGeneric & 1U) == 0) || (allowGeneric)) {
      ctx_local._7_1_ = true;
    }
    else {
      anon_unknown.dwarf_8df1c::Report(ctx,source,"ERROR: cannot take typeid from generic type");
      ctx_local._7_1_ = false;
    }
  }
  return ctx_local._7_1_;
}

Assistant:

bool AssertResolvableType(ExpressionContext &ctx, SynBase *source, TypeBase *type, bool allowGeneric)
{
	if(isType<TypeArgumentSet>(type))
	{
		Report(ctx, source, "ERROR: expected '.first'/'.last'/'[N]'/'.size' after 'argument'");

		return false;
	}

	if(isType<TypeMemberSet>(type))
	{
		Report(ctx, source, "ERROR: expected '(' after 'hasMember'");

		return false;
	}

	if(type->isGeneric && !allowGeneric)
	{
		Report(ctx, source, "ERROR: cannot take typeid from generic type");

		return false;
	}

	return true;
}